

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QItemSelection *
mergeIndexes(QItemSelection *__return_storage_ptr__,QList<QPersistentModelIndex> *indexes)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QPersistentModelIndex *this;
  QPersistentModelIndex *pQVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  QModelIndex local_108;
  QPersistentModelIndex br;
  QItemSelectionRange local_d8;
  QAbstractItemModel *local_c8;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  undefined8 local_98;
  QPersistentModelIndexData *pQStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined8 local_78;
  QPersistentModelIndexData *pQStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  uVar9 = 0;
  while( true ) {
    iVar3 = (int)uVar9;
    uVar9 = (ulong)iVar3;
    if ((indexes->d).size <= (long)uVar9) break;
    this = (indexes->d).ptr + uVar9;
    bVar1 = QPersistentModelIndex::isValid(this);
    if (bVar1) {
      br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex(&br,this);
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::parent((QModelIndex *)&local_78,&br);
      iVar2 = QPersistentModelIndex::row(&br);
      iVar3 = QPersistentModelIndex::column(&br);
      while( true ) {
        lVar8 = uVar9 << 3;
        do {
          lVar10 = lVar8;
          uVar9 = uVar9 + 1;
          if ((indexes->d).size <= (long)uVar9) goto LAB_00402d68;
          pQVar7 = (indexes->d).ptr;
          bVar1 = QPersistentModelIndex::isValid
                            ((QPersistentModelIndex *)((long)&pQVar7[1].d + lVar10));
          lVar8 = lVar10 + 8;
        } while (!bVar1);
        local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_90 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar7 = (QPersistentModelIndex *)((long)&pQVar7[1].d + lVar10);
        QPersistentModelIndex::parent((QModelIndex *)&local_98,pQVar7);
        iVar4 = QPersistentModelIndex::row(pQVar7);
        iVar5 = QPersistentModelIndex::column(pQVar7);
        iVar6 = memcmp(&local_98,&local_78,0x18);
        if (((iVar6 != 0) || (iVar4 != iVar2)) || (iVar5 != iVar3 + 1)) break;
        QPersistentModelIndex::operator=(&br,pQVar7);
        local_68.ptr = local_88.ptr;
        local_78 = local_98;
        pQStack_70 = pQStack_90;
        iVar3 = iVar5;
      }
LAB_00402d68:
      QPersistentModelIndex::operator_cast_to_QModelIndex(this);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&br);
      QItemSelectionRange::QItemSelectionRange
                (&local_d8,(QModelIndex *)&local_98,(QModelIndex *)&local_b8);
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                ((QList<QItemSelectionRange> *)&local_58,&local_d8);
      QItemSelectionRange::~QItemSelectionRange(&local_d8);
      QPersistentModelIndex::~QPersistentModelIndex(&br);
    }
    else {
      uVar9 = (ulong)(iVar3 + 1);
    }
  }
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  lVar8 = 0;
  do {
    lVar8 = (long)(int)lVar8;
    if (local_58.size <= lVar8) {
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58.ptr[lVar8].tl);
    local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_90 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58.ptr[lVar8].br);
    iVar3 = local_78._4_4_;
    iVar2 = (int)local_78;
    lVar10 = lVar8 * 0x10;
    while( true ) {
      lVar8 = lVar8 + 1;
      if (local_58.size <= lVar8) break;
      local_a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)((long)&local_58.ptr[1].tl.d + lVar10));
      local_c8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)((long)&local_58.ptr[1].br.d + lVar10));
      QModelIndex::parent((QModelIndex *)&br,(QModelIndex *)&local_b8);
      QModelIndex::parent(&local_108,(QModelIndex *)&local_78);
      bVar1 = operator!=((QModelIndex *)&br,&local_108);
      if ((((bVar1) || (local_b8._4_4_ != iVar3)) || (local_d8.tl.d._4_4_ != local_98._4_4_)) ||
         (((int)local_b8 != iVar2 + 1 || ((int)local_d8.tl.d != (int)local_98 + 1)))) break;
      local_88.ptr = local_c8;
      local_98 = local_d8.tl.d;
      pQStack_90 = local_d8.br.d;
      iVar2 = (int)local_b8;
      lVar10 = lVar10 + 0x10;
    }
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)&local_b8,(QModelIndex *)&local_78,(QModelIndex *)&local_98);
    QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
              (&__return_storage_ptr__->super_QList<QItemSelectionRange>,
               (QItemSelectionRange *)&local_b8);
    QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_b8);
  } while( true );
}

Assistant:

static QItemSelection mergeIndexes(const QList<QPersistentModelIndex> &indexes)
{
    QItemSelection colSpans;
    // merge columns
    int i = 0;
    while (i < indexes.size()) {
        const QPersistentModelIndex &tl = indexes.at(i);
        if (!tl.isValid()) {
            ++i;
            continue;
        }
        QPersistentModelIndex br = tl;
        QModelIndex brParent = br.parent();
        int brRow = br.row();
        int brColumn = br.column();
        while (++i < indexes.size()) {
            const QPersistentModelIndex &next = indexes.at(i);
            if (!next.isValid())
                continue;
            const QModelIndex nextParent = next.parent();
            const int nextRow = next.row();
            const int nextColumn = next.column();
            if ((nextParent == brParent)
                 && (nextRow == brRow)
                 && (nextColumn == brColumn + 1)) {
                br = next;
                brParent = nextParent;
                brRow = nextRow;
                brColumn = nextColumn;
            } else {
                break;
            }
        }
        colSpans.append(QItemSelectionRange(tl, br));
    }
    // merge rows
    QItemSelection rowSpans;
    i = 0;
    while (i < colSpans.size()) {
        QModelIndex tl = colSpans.at(i).topLeft();
        QModelIndex br = colSpans.at(i).bottomRight();
        QModelIndex prevTl = tl;
        while (++i < colSpans.size()) {
            QModelIndex nextTl = colSpans.at(i).topLeft();
            QModelIndex nextBr = colSpans.at(i).bottomRight();

            if (nextTl.parent() != tl.parent())
                break; // we can't merge selection ranges from different parents

            if ((nextTl.column() == prevTl.column()) && (nextBr.column() == br.column())
                && (nextTl.row() == prevTl.row() + 1) && (nextBr.row() == br.row() + 1)) {
                br = nextBr;
                prevTl = nextTl;
            } else {
                break;
            }
        }
        rowSpans.append(QItemSelectionRange(tl, br));
    }
    return rowSpans;
}